

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O3

bool __thiscall cmDocumentation::PrintHelpOneManual(cmDocumentation *this,ostream *os)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  long *plVar4;
  ostream *poVar5;
  size_type *psVar6;
  cmDocumentation *pcVar7;
  string mname;
  string local_b0;
  undefined1 local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [32];
  
  pcVar1 = (this->CurrentArgument)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (this->CurrentArgument)._M_string_length);
  if (((3 < local_70._M_string_length) &&
      ((local_70._M_dataplus._M_p + -3)[local_70._M_string_length] == '(')) &&
     ((local_70._M_dataplus._M_p + -1)[local_70._M_string_length] == ')')) {
    std::__cxx11::string::substr((ulong)local_90,(ulong)&local_70);
    plVar4 = (long *)std::__cxx11::string::append(local_90);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0.field_2._8_8_ = plVar4[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_b0,local_b0._M_string_length,0,'\x01');
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      local_50._16_8_ = *psVar6;
      local_50._24_8_ = plVar4[3];
      local_50._0_8_ = local_50 + 0x10;
    }
    else {
      local_50._16_8_ = *psVar6;
      local_50._0_8_ = (size_type *)*plVar4;
    }
    local_50._8_8_ = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
  }
  pcVar7 = (cmDocumentation *)local_50;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7,
                 "manual/",&local_70);
  bVar2 = PrintFiles(pcVar7,os,(string *)local_50);
  bVar3 = true;
  if (!bVar2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   "manual/",&local_70);
    pcVar7 = (cmDocumentation *)local_90;
    plVar4 = (long *)std::__cxx11::string::append((char *)pcVar7);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0.field_2._8_8_ = plVar4[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    bVar3 = PrintFiles(pcVar7,os,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
  }
  if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  if (bVar3 == false) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Argument \"",10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(this->CurrentArgument)._M_dataplus._M_p,
                        (this->CurrentArgument)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\" to --help-manual is not an available manual.  ",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Use --help-manual-list to see all available manuals.\n",0x35);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmDocumentation::PrintHelpOneManual(std::ostream& os)
{
  std::string mname = this->CurrentArgument;
  std::string::size_type mlen = mname.length();
  if(mlen > 3 && mname[mlen-3] == '(' &&
                 mname[mlen-1] == ')')
    {
    mname = mname.substr(0, mlen-3) + "." + mname[mlen-2];
    }
  if(this->PrintFiles(os, "manual/" + mname) ||
     this->PrintFiles(os, "manual/" + mname + ".[0-9]"))
    {
    return true;
    }
  // Argument was not a manual.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-manual is not an available manual.  "
     << "Use --help-manual-list to see all available manuals.\n";
  return false;
}